

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_packed.h
# Opt level: O0

void ncnn::convolution_transform_kernel_packed
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int iVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float *k0_15;
  int k_15;
  int i_9;
  float *k0_14;
  int k_14;
  int i_8;
  float *k0_13;
  int k_13;
  int i_7;
  float *k0_12;
  int k_12;
  int p_3;
  float *g00_3;
  float *kptr;
  float *k1_11;
  float *k0_11;
  int k_11;
  int i_6;
  float *k1_10;
  float *k0_10;
  int k_10;
  float *k1_9;
  float *k0_9;
  int k_9;
  float *k1_8;
  float *k0_8;
  int k_8;
  int p_2;
  float *g00_2;
  float *kptr1_2;
  float *kptr0_2;
  float *k3_7;
  float *k2_7;
  float *k1_7;
  float *k0_7;
  int k_7;
  int i_5;
  float *k3_6;
  float *k2_6;
  float *k1_6;
  float *k0_6;
  int k_6;
  int i_4;
  float *k3_5;
  float *k2_5;
  float *k1_5;
  float *k0_5;
  int k_5;
  int i_3;
  float *k3_4;
  float *k2_4;
  float *k1_4;
  float *k0_4;
  int k_4;
  int p_1;
  float *g00_1;
  float *kptr3_1;
  float *kptr2_1;
  float *kptr1_1;
  float *kptr0_1;
  float *k7_3;
  float *k6_3;
  float *k5_3;
  float *k4_3;
  float *k3_3;
  float *k2_3;
  float *k1_3;
  float *k0_3;
  int k_3;
  int i_2;
  float *k7_2;
  float *k6_2;
  float *k5_2;
  float *k4_2;
  float *k3_2;
  float *k2_2;
  float *k1_2;
  float *k0_2;
  int k_2;
  int i_1;
  float *k7_1;
  float *k6_1;
  float *k5_1;
  float *k4_1;
  float *k3_1;
  float *k2_1;
  float *k1_1;
  float *k0_1;
  int k_1;
  int i;
  float *k7;
  float *k6;
  float *k5;
  float *k4;
  float *k3;
  float *k2;
  float *k1;
  float *k0;
  int k;
  int p;
  float *g00;
  float *kptr7;
  float *kptr6;
  float *kptr5;
  float *kptr4;
  float *kptr3;
  float *kptr2;
  float *kptr1;
  float *kptr0;
  int q;
  int maxk;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e4;
  undefined4 in_stack_fffffffffffff6e8;
  undefined4 in_stack_fffffffffffff6ec;
  undefined8 in_stack_fffffffffffff6f0;
  int _c;
  int _h;
  undefined8 in_stack_fffffffffffff6f8;
  int _w;
  Mat *in_stack_fffffffffffff700;
  int local_7e0;
  int local_7dc;
  undefined4 *local_7d8;
  int local_7d0;
  int local_7cc;
  undefined4 *local_7c8;
  int local_7c0;
  int local_7bc;
  undefined4 *local_7b8;
  int local_7b0;
  int local_7ac;
  undefined4 *local_760;
  long local_758;
  int local_740;
  int local_73c;
  undefined4 *local_738;
  undefined4 *local_730;
  int local_724;
  int local_70c;
  int local_6f8;
  int local_6f4;
  undefined4 *local_6a8;
  long local_6a0;
  long local_698;
  int local_670;
  int local_66c;
  undefined4 *local_668;
  undefined4 *local_660;
  undefined4 *local_658;
  undefined4 *local_650;
  int local_648;
  int local_644;
  undefined4 *local_640;
  undefined4 *local_638;
  undefined4 *local_630;
  undefined4 *local_628;
  int local_620;
  int local_61c;
  undefined4 *local_618;
  undefined4 *local_610;
  undefined4 *local_608;
  undefined4 *local_600;
  int local_5f8;
  int local_5f4;
  undefined4 *local_5a8;
  long local_5a0;
  long local_598;
  long local_590;
  long local_588;
  int local_540;
  int local_53c;
  undefined4 *local_538;
  undefined4 *local_530;
  undefined4 *local_528;
  undefined4 *local_520;
  undefined4 *local_518;
  undefined4 *local_510;
  undefined4 *local_508;
  undefined4 *local_500;
  int local_4f8;
  int local_4f4;
  undefined4 *local_4f0;
  undefined4 *local_4e8;
  undefined4 *local_4e0;
  undefined4 *local_4d8;
  undefined4 *local_4d0;
  undefined4 *local_4c8;
  undefined4 *local_4c0;
  undefined4 *local_4b8;
  int local_4b0;
  int local_4ac;
  undefined4 *local_4a8;
  undefined4 *local_4a0;
  undefined4 *local_498;
  undefined4 *local_490;
  undefined4 *local_488;
  undefined4 *local_480;
  undefined4 *local_478;
  undefined4 *local_470;
  int local_464;
  int local_460;
  undefined4 *local_408;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  int local_3c0;
  
  iVar1 = in_R8D * in_R9D;
  _c = (int)((ulong)in_stack_fffffffffffff6f0 >> 0x20);
  _h = (int)in_stack_fffffffffffff6f8;
  _w = (int)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
  if (in_ECX < 8) {
    if (in_ECX < 4) {
      if (in_ECX < 2) {
        if (in_EDX < 8) {
          if (in_EDX < 4) {
            if (in_EDX < 2) {
              Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                          CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                          (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0)
                         );
            }
            else {
              Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                          CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                          (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0)
                         );
            }
          }
          else {
            Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                        CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                        (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
          }
        }
        else {
          Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
        }
      }
      else if (in_EDX < 8) {
        if (in_EDX < 4) {
          if (in_EDX < 2) {
            Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                        CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                        (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
          }
          else {
            Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                        CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                        (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
          }
        }
        else {
          Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
        }
      }
      else {
        Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                    (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
      }
    }
    else if (in_EDX < 8) {
      if (in_EDX < 4) {
        if (in_EDX < 2) {
          Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
        }
        else {
          Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
        }
      }
      else {
        Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                    (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
      }
    }
    else {
      Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                  CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                  (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
    }
  }
  else if (in_EDX < 8) {
    if (in_EDX < 4) {
      if (in_EDX < 2) {
        Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                    (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
      }
      else {
        Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                    (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
      }
    }
    else {
      Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                  CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                  (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
    }
  }
  else {
    Mat::create(in_stack_fffffffffffff700,_w,_h,_c,
                CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                (Allocator *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
  }
  for (local_3c0 = 0; local_3c0 + 7 < in_ECX; local_3c0 = local_3c0 + 8) {
    local_3c8 = *in_RDI + (long)(local_3c0 * in_EDX * iVar1) * 4;
    local_3d0 = *in_RDI + (long)((local_3c0 + 1) * in_EDX * iVar1) * 4;
    local_3d8 = *in_RDI + (long)((local_3c0 + 2) * in_EDX * iVar1) * 4;
    local_3e0 = *in_RDI + (long)((local_3c0 + 3) * in_EDX * iVar1) * 4;
    local_3e8 = *in_RDI + (long)((local_3c0 + 4) * in_EDX * iVar1) * 4;
    local_3f0 = *in_RDI + (long)((local_3c0 + 5) * in_EDX * iVar1) * 4;
    local_3f8 = *in_RDI + (long)((local_3c0 + 6) * in_EDX * iVar1) * 4;
    local_400 = *in_RDI + (long)((local_3c0 + 7) * in_EDX * iVar1) * 4;
    local_408 = (undefined4 *)(*in_RSI + in_RSI[8] * (long)(local_3c0 / 8) * in_RSI[2]);
    for (local_460 = 0; local_460 + 7 < in_EDX; local_460 = local_460 + 8) {
      for (local_464 = 0; local_464 < iVar1; local_464 = local_464 + 1) {
        local_470 = (undefined4 *)(local_3c8 + (long)local_464 * 4);
        local_478 = (undefined4 *)(local_3d0 + (long)local_464 * 4);
        local_480 = (undefined4 *)(local_3d8 + (long)local_464 * 4);
        local_488 = (undefined4 *)(local_3e0 + (long)local_464 * 4);
        local_490 = (undefined4 *)(local_3e8 + (long)local_464 * 4);
        local_498 = (undefined4 *)(local_3f0 + (long)local_464 * 4);
        local_4a0 = (undefined4 *)(local_3f8 + (long)local_464 * 4);
        local_4a8 = (undefined4 *)(local_400 + (long)local_464 * 4);
        for (local_4ac = 0; local_4ac < 8; local_4ac = local_4ac + 1) {
          *local_408 = *local_470;
          local_408[1] = *local_478;
          local_408[2] = *local_480;
          local_408[3] = *local_488;
          local_408[4] = *local_490;
          local_408[5] = *local_498;
          local_408[6] = *local_4a0;
          local_408[7] = *local_4a8;
          local_470 = local_470 + iVar1;
          local_478 = local_478 + iVar1;
          local_480 = local_480 + iVar1;
          local_488 = local_488 + iVar1;
          local_490 = local_490 + iVar1;
          local_498 = local_498 + iVar1;
          local_4a0 = local_4a0 + iVar1;
          local_4a8 = local_4a8 + iVar1;
          local_408 = local_408 + 8;
        }
      }
      local_3c8 = local_3c8 + (long)(iVar1 * 8) * 4;
      local_3d0 = local_3d0 + (long)(iVar1 * 8) * 4;
      local_3d8 = local_3d8 + (long)(iVar1 * 8) * 4;
      local_3e0 = local_3e0 + (long)(iVar1 * 8) * 4;
      local_3e8 = local_3e8 + (long)(iVar1 * 8) * 4;
      local_3f0 = local_3f0 + (long)(iVar1 * 8) * 4;
      local_3f8 = local_3f8 + (long)(iVar1 * 8) * 4;
      local_400 = local_400 + (long)(iVar1 * 8) * 4;
    }
    for (; local_460 + 3 < in_EDX; local_460 = local_460 + 4) {
      for (local_4b0 = 0; local_4b0 < iVar1; local_4b0 = local_4b0 + 1) {
        local_4b8 = (undefined4 *)(local_3c8 + (long)local_4b0 * 4);
        local_4c0 = (undefined4 *)(local_3d0 + (long)local_4b0 * 4);
        local_4c8 = (undefined4 *)(local_3d8 + (long)local_4b0 * 4);
        local_4d0 = (undefined4 *)(local_3e0 + (long)local_4b0 * 4);
        local_4d8 = (undefined4 *)(local_3e8 + (long)local_4b0 * 4);
        local_4e0 = (undefined4 *)(local_3f0 + (long)local_4b0 * 4);
        local_4e8 = (undefined4 *)(local_3f8 + (long)local_4b0 * 4);
        local_4f0 = (undefined4 *)(local_400 + (long)local_4b0 * 4);
        for (local_4f4 = 0; local_4f4 < 4; local_4f4 = local_4f4 + 1) {
          *local_408 = *local_4b8;
          local_408[1] = *local_4c0;
          local_408[2] = *local_4c8;
          local_408[3] = *local_4d0;
          local_408[4] = *local_4d8;
          local_408[5] = *local_4e0;
          local_408[6] = *local_4e8;
          local_408[7] = *local_4f0;
          local_4b8 = local_4b8 + iVar1;
          local_4c0 = local_4c0 + iVar1;
          local_4c8 = local_4c8 + iVar1;
          local_4d0 = local_4d0 + iVar1;
          local_4d8 = local_4d8 + iVar1;
          local_4e0 = local_4e0 + iVar1;
          local_4e8 = local_4e8 + iVar1;
          local_4f0 = local_4f0 + iVar1;
          local_408 = local_408 + 8;
        }
      }
      local_3c8 = local_3c8 + (long)(iVar1 * 4) * 4;
      local_3d0 = local_3d0 + (long)(iVar1 * 4) * 4;
      local_3d8 = local_3d8 + (long)(iVar1 * 4) * 4;
      local_3e0 = local_3e0 + (long)(iVar1 * 4) * 4;
      local_3e8 = local_3e8 + (long)(iVar1 * 4) * 4;
      local_3f0 = local_3f0 + (long)(iVar1 * 4) * 4;
      local_3f8 = local_3f8 + (long)(iVar1 * 4) * 4;
      local_400 = local_400 + (long)(iVar1 * 4) * 4;
    }
    for (; local_460 + 1 < in_EDX; local_460 = local_460 + 2) {
      for (local_4f8 = 0; local_4f8 < iVar1; local_4f8 = local_4f8 + 1) {
        local_500 = (undefined4 *)(local_3c8 + (long)local_4f8 * 4);
        local_508 = (undefined4 *)(local_3d0 + (long)local_4f8 * 4);
        local_510 = (undefined4 *)(local_3d8 + (long)local_4f8 * 4);
        local_518 = (undefined4 *)(local_3e0 + (long)local_4f8 * 4);
        local_520 = (undefined4 *)(local_3e8 + (long)local_4f8 * 4);
        local_528 = (undefined4 *)(local_3f0 + (long)local_4f8 * 4);
        local_530 = (undefined4 *)(local_3f8 + (long)local_4f8 * 4);
        local_538 = (undefined4 *)(local_400 + (long)local_4f8 * 4);
        for (local_53c = 0; local_53c < 2; local_53c = local_53c + 1) {
          *local_408 = *local_500;
          local_408[1] = *local_508;
          local_408[2] = *local_510;
          local_408[3] = *local_518;
          local_408[4] = *local_520;
          local_408[5] = *local_528;
          local_408[6] = *local_530;
          local_408[7] = *local_538;
          local_500 = local_500 + iVar1;
          local_508 = local_508 + iVar1;
          local_510 = local_510 + iVar1;
          local_518 = local_518 + iVar1;
          local_520 = local_520 + iVar1;
          local_528 = local_528 + iVar1;
          local_530 = local_530 + iVar1;
          local_538 = local_538 + iVar1;
          local_408 = local_408 + 8;
        }
      }
      local_3c8 = local_3c8 + (long)(iVar1 * 2) * 4;
      local_3d0 = local_3d0 + (long)(iVar1 * 2) * 4;
      local_3d8 = local_3d8 + (long)(iVar1 * 2) * 4;
      local_3e0 = local_3e0 + (long)(iVar1 * 2) * 4;
      local_3e8 = local_3e8 + (long)(iVar1 * 2) * 4;
      local_3f0 = local_3f0 + (long)(iVar1 * 2) * 4;
      local_3f8 = local_3f8 + (long)(iVar1 * 2) * 4;
      local_400 = local_400 + (long)(iVar1 * 2) * 4;
    }
    for (; local_460 < in_EDX; local_460 = local_460 + 1) {
      for (local_540 = 0; local_540 < iVar1; local_540 = local_540 + 1) {
        *local_408 = *(undefined4 *)(local_3c8 + (long)local_540 * 4);
        local_408[1] = *(undefined4 *)(local_3d0 + (long)local_540 * 4);
        local_408[2] = *(undefined4 *)(local_3d8 + (long)local_540 * 4);
        local_408[3] = *(undefined4 *)(local_3e0 + (long)local_540 * 4);
        local_408[4] = *(undefined4 *)(local_3e8 + (long)local_540 * 4);
        local_408[5] = *(undefined4 *)(local_3f0 + (long)local_540 * 4);
        local_408[6] = *(undefined4 *)(local_3f8 + (long)local_540 * 4);
        local_408[7] = *(undefined4 *)(local_400 + (long)local_540 * 4);
        local_408 = local_408 + 8;
      }
    }
  }
  for (; local_3c0 + 3 < in_ECX; local_3c0 = local_3c0 + 4) {
    local_588 = *in_RDI + (long)(local_3c0 * in_EDX * iVar1) * 4;
    local_590 = *in_RDI + (long)((local_3c0 + 1) * in_EDX * iVar1) * 4;
    local_598 = *in_RDI + (long)((local_3c0 + 2) * in_EDX * iVar1) * 4;
    local_5a0 = *in_RDI + (long)((local_3c0 + 3) * in_EDX * iVar1) * 4;
    local_5a8 = (undefined4 *)
                (*in_RSI +
                in_RSI[8] *
                (long)(local_3c0 / 8 +
                      (int)((long)((ulong)(uint)((int)((long)local_3c0 % 8) >> 0x1f) << 0x20 |
                                  (long)local_3c0 % 8 & 0xffffffffU) / 4)) * in_RSI[2]);
    for (local_5f4 = 0; local_5f4 + 7 < in_EDX; local_5f4 = local_5f4 + 8) {
      for (local_5f8 = 0; local_5f8 < iVar1; local_5f8 = local_5f8 + 1) {
        local_600 = (undefined4 *)(local_588 + (long)local_5f8 * 4);
        local_608 = (undefined4 *)(local_590 + (long)local_5f8 * 4);
        local_610 = (undefined4 *)(local_598 + (long)local_5f8 * 4);
        local_618 = (undefined4 *)(local_5a0 + (long)local_5f8 * 4);
        for (local_61c = 0; local_61c < 8; local_61c = local_61c + 1) {
          *local_5a8 = *local_600;
          local_5a8[1] = *local_608;
          local_5a8[2] = *local_610;
          local_5a8[3] = *local_618;
          local_600 = local_600 + iVar1;
          local_608 = local_608 + iVar1;
          local_610 = local_610 + iVar1;
          local_618 = local_618 + iVar1;
          local_5a8 = local_5a8 + 4;
        }
      }
      local_588 = local_588 + (long)(iVar1 * 8) * 4;
      local_590 = local_590 + (long)(iVar1 * 8) * 4;
      local_598 = local_598 + (long)(iVar1 * 8) * 4;
      local_5a0 = local_5a0 + (long)(iVar1 * 8) * 4;
    }
    for (; local_5f4 + 3 < in_EDX; local_5f4 = local_5f4 + 4) {
      for (local_620 = 0; local_620 < iVar1; local_620 = local_620 + 1) {
        local_628 = (undefined4 *)(local_588 + (long)local_620 * 4);
        local_630 = (undefined4 *)(local_590 + (long)local_620 * 4);
        local_638 = (undefined4 *)(local_598 + (long)local_620 * 4);
        local_640 = (undefined4 *)(local_5a0 + (long)local_620 * 4);
        for (local_644 = 0; local_644 < 4; local_644 = local_644 + 1) {
          *local_5a8 = *local_628;
          local_5a8[1] = *local_630;
          local_5a8[2] = *local_638;
          local_5a8[3] = *local_640;
          local_628 = local_628 + iVar1;
          local_630 = local_630 + iVar1;
          local_638 = local_638 + iVar1;
          local_640 = local_640 + iVar1;
          local_5a8 = local_5a8 + 4;
        }
      }
      local_588 = local_588 + (long)(iVar1 * 4) * 4;
      local_590 = local_590 + (long)(iVar1 * 4) * 4;
      local_598 = local_598 + (long)(iVar1 * 4) * 4;
      local_5a0 = local_5a0 + (long)(iVar1 * 4) * 4;
    }
    for (; local_5f4 + 1 < in_EDX; local_5f4 = local_5f4 + 2) {
      for (local_648 = 0; local_648 < iVar1; local_648 = local_648 + 1) {
        local_650 = (undefined4 *)(local_588 + (long)local_648 * 4);
        local_658 = (undefined4 *)(local_590 + (long)local_648 * 4);
        local_660 = (undefined4 *)(local_598 + (long)local_648 * 4);
        local_668 = (undefined4 *)(local_5a0 + (long)local_648 * 4);
        for (local_66c = 0; local_66c < 2; local_66c = local_66c + 1) {
          *local_5a8 = *local_650;
          local_5a8[1] = *local_658;
          local_5a8[2] = *local_660;
          local_5a8[3] = *local_668;
          local_650 = local_650 + iVar1;
          local_658 = local_658 + iVar1;
          local_660 = local_660 + iVar1;
          local_668 = local_668 + iVar1;
          local_5a8 = local_5a8 + 4;
        }
      }
      local_588 = local_588 + (long)(iVar1 * 2) * 4;
      local_590 = local_590 + (long)(iVar1 * 2) * 4;
      local_598 = local_598 + (long)(iVar1 * 2) * 4;
      local_5a0 = local_5a0 + (long)(iVar1 * 2) * 4;
    }
    for (; local_5f4 < in_EDX; local_5f4 = local_5f4 + 1) {
      for (local_670 = 0; local_670 < iVar1; local_670 = local_670 + 1) {
        *local_5a8 = *(undefined4 *)(local_588 + (long)local_670 * 4);
        local_5a8[1] = *(undefined4 *)(local_590 + (long)local_670 * 4);
        local_5a8[2] = *(undefined4 *)(local_598 + (long)local_670 * 4);
        local_5a8[3] = *(undefined4 *)(local_5a0 + (long)local_670 * 4);
        local_5a8 = local_5a8 + 4;
      }
    }
  }
  for (; local_3c0 + 1 < in_ECX; local_3c0 = local_3c0 + 2) {
    local_698 = *in_RDI + (long)(local_3c0 * in_EDX * iVar1) * 4;
    local_6a0 = *in_RDI + (long)((local_3c0 + 1) * in_EDX * iVar1) * 4;
    local_6a8 = (undefined4 *)
                (*in_RSI +
                in_RSI[8] *
                (long)(local_3c0 / 8 +
                       (int)((long)((ulong)(uint)((int)((long)local_3c0 % 8) >> 0x1f) << 0x20 |
                                   (long)local_3c0 % 8 & 0xffffffffU) / 4) +
                      (int)((long)((ulong)(uint)((int)((long)local_3c0 % 4) >> 0x1f) << 0x20 |
                                  (long)local_3c0 % 4 & 0xffffffffU) / 2)) * in_RSI[2]);
    for (local_6f4 = 0; local_6f4 + 7 < in_EDX; local_6f4 = local_6f4 + 8) {
      for (local_6f8 = 0; local_6f8 < iVar1; local_6f8 = local_6f8 + 1) {
        puVar2 = (undefined4 *)(local_698 + (long)local_6f8 * 4);
        puVar3 = (undefined4 *)(local_6a0 + (long)local_6f8 * 4);
        *local_6a8 = *puVar2;
        local_6a8[1] = puVar2[iVar1];
        local_6a8[2] = puVar2[iVar1 * 2];
        local_6a8[3] = puVar2[iVar1 * 3];
        local_6a8[4] = puVar2[iVar1 * 4];
        local_6a8[5] = puVar2[iVar1 * 5];
        local_6a8[6] = puVar2[iVar1 * 6];
        local_6a8[7] = puVar2[iVar1 * 7];
        local_6a8[8] = *puVar3;
        local_6a8[9] = puVar3[iVar1];
        local_6a8[10] = puVar3[iVar1 * 2];
        local_6a8[0xb] = puVar3[iVar1 * 3];
        local_6a8[0xc] = puVar3[iVar1 * 4];
        local_6a8[0xd] = puVar3[iVar1 * 5];
        local_6a8[0xe] = puVar3[iVar1 * 6];
        local_6a8[0xf] = puVar3[iVar1 * 7];
        local_6a8 = local_6a8 + 0x10;
      }
      local_698 = local_698 + (long)(iVar1 * 8) * 4;
      local_6a0 = local_6a0 + (long)(iVar1 * 8) * 4;
    }
    for (; local_6f4 + 3 < in_EDX; local_6f4 = local_6f4 + 4) {
      for (local_70c = 0; local_70c < iVar1; local_70c = local_70c + 1) {
        puVar2 = (undefined4 *)(local_698 + (long)local_70c * 4);
        puVar3 = (undefined4 *)(local_6a0 + (long)local_70c * 4);
        *local_6a8 = *puVar2;
        local_6a8[1] = puVar2[iVar1];
        local_6a8[2] = puVar2[iVar1 * 2];
        local_6a8[3] = puVar2[iVar1 * 3];
        local_6a8[4] = *puVar3;
        local_6a8[5] = puVar3[iVar1];
        local_6a8[6] = puVar3[iVar1 * 2];
        local_6a8[7] = puVar3[iVar1 * 3];
        local_6a8 = local_6a8 + 8;
      }
      local_698 = local_698 + (long)(iVar1 * 4) * 4;
      local_6a0 = local_6a0 + (long)(iVar1 * 4) * 4;
    }
    for (; local_6f4 + 1 < in_EDX; local_6f4 = local_6f4 + 2) {
      for (local_724 = 0; local_724 < iVar1; local_724 = local_724 + 1) {
        local_730 = (undefined4 *)(local_698 + (long)local_724 * 4);
        local_738 = (undefined4 *)(local_6a0 + (long)local_724 * 4);
        for (local_73c = 0; local_73c < 2; local_73c = local_73c + 1) {
          *local_6a8 = *local_730;
          local_6a8[1] = *local_738;
          local_730 = local_730 + iVar1;
          local_738 = local_738 + iVar1;
          local_6a8 = local_6a8 + 2;
        }
      }
      local_698 = local_698 + (long)(iVar1 * 2) * 4;
      local_6a0 = local_6a0 + (long)(iVar1 * 2) * 4;
    }
    for (; local_6f4 < in_EDX; local_6f4 = local_6f4 + 1) {
      for (local_740 = 0; local_740 < iVar1; local_740 = local_740 + 1) {
        *local_6a8 = *(undefined4 *)(local_698 + (long)local_740 * 4);
        local_6a8[1] = *(undefined4 *)(local_6a0 + (long)local_740 * 4);
        local_6a8 = local_6a8 + 2;
      }
    }
  }
  for (; local_3c0 < in_ECX; local_3c0 = local_3c0 + 1) {
    local_758 = *in_RDI + (long)(local_3c0 * in_EDX * iVar1) * 4;
    local_760 = (undefined4 *)
                (*in_RSI +
                in_RSI[8] *
                (long)(local_3c0 / 8 +
                       (int)((long)((ulong)(uint)((int)((long)local_3c0 % 8) >> 0x1f) << 0x20 |
                                   (long)local_3c0 % 8 & 0xffffffffU) / 4) +
                       (int)((long)((ulong)(uint)((int)((long)local_3c0 % 4) >> 0x1f) << 0x20 |
                                   (long)local_3c0 % 4 & 0xffffffffU) / 2) + local_3c0 % 2) *
                in_RSI[2]);
    for (local_7ac = 0; local_7ac + 7 < in_EDX; local_7ac = local_7ac + 8) {
      for (local_7b0 = 0; local_7b0 < iVar1; local_7b0 = local_7b0 + 1) {
        local_7b8 = (undefined4 *)(local_758 + (long)local_7b0 * 4);
        for (local_7bc = 0; local_7bc < 8; local_7bc = local_7bc + 1) {
          *local_760 = *local_7b8;
          local_7b8 = local_7b8 + iVar1;
          local_760 = local_760 + 1;
        }
      }
      local_758 = local_758 + (long)(iVar1 * 8) * 4;
    }
    for (; local_7ac + 3 < in_EDX; local_7ac = local_7ac + 4) {
      for (local_7c0 = 0; local_7c0 < iVar1; local_7c0 = local_7c0 + 1) {
        local_7c8 = (undefined4 *)(local_758 + (long)local_7c0 * 4);
        for (local_7cc = 0; local_7cc < 4; local_7cc = local_7cc + 1) {
          *local_760 = *local_7c8;
          local_7c8 = local_7c8 + iVar1;
          local_760 = local_760 + 1;
        }
      }
      local_758 = local_758 + (long)(iVar1 * 4) * 4;
    }
    for (; local_7ac + 1 < in_EDX; local_7ac = local_7ac + 2) {
      for (local_7d0 = 0; local_7d0 < iVar1; local_7d0 = local_7d0 + 1) {
        local_7d8 = (undefined4 *)(local_758 + (long)local_7d0 * 4);
        for (local_7dc = 0; local_7dc < 2; local_7dc = local_7dc + 1) {
          *local_760 = *local_7d8;
          local_7d8 = local_7d8 + iVar1;
          local_760 = local_760 + 1;
        }
      }
      local_758 = local_758 + (long)(iVar1 * 2) * 4;
    }
    for (; local_7ac < in_EDX; local_7ac = local_7ac + 1) {
      for (local_7e0 = 0; local_7e0 < iVar1; local_7e0 = local_7e0 + 1) {
        *local_760 = *(undefined4 *)(local_758 + (long)local_7e0 * 4);
        local_760 = local_760 + 1;
      }
    }
  }
  return;
}

Assistant:

static void convolution_transform_kernel_packed(const Mat& kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb

    // clang-format off
    // *INDENT-OFF*
#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (outch >= 16)
    {
        if (inch >= 16)
            kernel_tm.create(16 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 8)
            kernel_tm.create(16 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 4)
            kernel_tm.create(16 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 2)
            kernel_tm.create(16 * 2 * maxk, inch / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else
            kernel_tm.create(16 * maxk, inch, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
    }
    else
#endif // __AVX512F__
    if (outch >= 8)
    {
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(8 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(8 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 4)
            kernel_tm.create(8 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 2)
            kernel_tm.create(8 * 2 * maxk, inch / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else
            kernel_tm.create(8 * maxk, inch, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
    }
    else
#endif // __AVX__
    if (outch >= 4)
    {
#if __AVX__
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(4 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(4 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else
#endif // __AVX__
        if (inch >= 4)
            kernel_tm.create(4 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 2)
            kernel_tm.create(4 * 2 * maxk, inch / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else
            kernel_tm.create(4 * maxk, inch, outch / 4 + (outch % 4) / 2 + outch % 2);
    }
    else
#endif // __SSE2__
    if (outch >= 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(2 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 2 + outch % 2);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(2 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 2 + outch % 2);
        else
#endif // __AVX__
        if (inch >= 4)
            kernel_tm.create(2 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 2 + outch % 2);
        else
#endif // __SSE2__
        if (inch >= 2)
            kernel_tm.create(2 * 2 * maxk, inch / 2 + inch % 2, outch / 2 + outch % 2);
        else
            kernel_tm.create(2 * maxk, inch, outch / 2 + outch % 2);
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch);
        else
#endif // __AVX__
        if (inch >= 4)
            kernel_tm.create(4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch);
        else
#endif // __SSE2__
        if (inch >= 2)
            kernel_tm.create(2 * maxk, inch / 2 + inch % 2, outch);
        else
            kernel_tm.create(maxk, inch, outch);
    }
    // *INDENT-ON*
    // clang-format on

    int q = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; q + 15 < outch; q += 16)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;
        const float* kptr2 = (const float*)kernel + (q + 2) * inch * maxk;
        const float* kptr3 = (const float*)kernel + (q + 3) * inch * maxk;
        const float* kptr4 = (const float*)kernel + (q + 4) * inch * maxk;
        const float* kptr5 = (const float*)kernel + (q + 5) * inch * maxk;
        const float* kptr6 = (const float*)kernel + (q + 6) * inch * maxk;
        const float* kptr7 = (const float*)kernel + (q + 7) * inch * maxk;
        const float* kptr8 = (const float*)kernel + (q + 8) * inch * maxk;
        const float* kptr9 = (const float*)kernel + (q + 9) * inch * maxk;
        const float* kptra = (const float*)kernel + (q + 10) * inch * maxk;
        const float* kptrb = (const float*)kernel + (q + 11) * inch * maxk;
        const float* kptrc = (const float*)kernel + (q + 12) * inch * maxk;
        const float* kptrd = (const float*)kernel + (q + 13) * inch * maxk;
        const float* kptre = (const float*)kernel + (q + 14) * inch * maxk;
        const float* kptrf = (const float*)kernel + (q + 15) * inch * maxk;

        float* g00 = kernel_tm.channel(q / 16);

        __m512i _vindex = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex = _mm512_mullo_epi32(_vindex, _mm512_set1_epi32(maxk));

        int p = 0;
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;
                const float* k8 = kptr8 + k;
                const float* k9 = kptr9 + k;
                const float* ka = kptra + k;
                const float* kb = kptrb + k;
                const float* kc = kptrc + k;
                const float* kd = kptrd + k;
                const float* ke = kptre + k;
                const float* kf = kptrf + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex, k1, sizeof(float));
                __m512 _k2 = _mm512_i32gather_ps(_vindex, k2, sizeof(float));
                __m512 _k3 = _mm512_i32gather_ps(_vindex, k3, sizeof(float));
                __m512 _k4 = _mm512_i32gather_ps(_vindex, k4, sizeof(float));
                __m512 _k5 = _mm512_i32gather_ps(_vindex, k5, sizeof(float));
                __m512 _k6 = _mm512_i32gather_ps(_vindex, k6, sizeof(float));
                __m512 _k7 = _mm512_i32gather_ps(_vindex, k7, sizeof(float));
                __m512 _k8 = _mm512_i32gather_ps(_vindex, k8, sizeof(float));
                __m512 _k9 = _mm512_i32gather_ps(_vindex, k9, sizeof(float));
                __m512 _ka = _mm512_i32gather_ps(_vindex, ka, sizeof(float));
                __m512 _kb = _mm512_i32gather_ps(_vindex, kb, sizeof(float));
                __m512 _kc = _mm512_i32gather_ps(_vindex, kc, sizeof(float));
                __m512 _kd = _mm512_i32gather_ps(_vindex, kd, sizeof(float));
                __m512 _ke = _mm512_i32gather_ps(_vindex, ke, sizeof(float));
                __m512 _kf = _mm512_i32gather_ps(_vindex, kf, sizeof(float));

                transpose16x16_ps(_k0, _k1, _k2, _k3, _k4, _k5, _k6, _k7, _k8, _k9, _ka, _kb, _kc, _kd, _ke, _kf);

                _mm512_store_ps(g00, _k0);
                _mm512_store_ps(g00 + 16, _k1);
                _mm512_store_ps(g00 + 16 * 2, _k2);
                _mm512_store_ps(g00 + 16 * 3, _k3);
                _mm512_store_ps(g00 + 16 * 4, _k4);
                _mm512_store_ps(g00 + 16 * 5, _k5);
                _mm512_store_ps(g00 + 16 * 6, _k6);
                _mm512_store_ps(g00 + 16 * 7, _k7);
                _mm512_store_ps(g00 + 16 * 8, _k8);
                _mm512_store_ps(g00 + 16 * 9, _k9);
                _mm512_store_ps(g00 + 16 * 10, _ka);
                _mm512_store_ps(g00 + 16 * 11, _kb);
                _mm512_store_ps(g00 + 16 * 12, _kc);
                _mm512_store_ps(g00 + 16 * 13, _kd);
                _mm512_store_ps(g00 + 16 * 14, _ke);
                _mm512_store_ps(g00 + 16 * 15, _kf);

                g00 += 256;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
            kptr2 += maxk * 16;
            kptr3 += maxk * 16;
            kptr4 += maxk * 16;
            kptr5 += maxk * 16;
            kptr6 += maxk * 16;
            kptr7 += maxk * 16;
            kptr8 += maxk * 16;
            kptr9 += maxk * 16;
            kptra += maxk * 16;
            kptrb += maxk * 16;
            kptrc += maxk * 16;
            kptrd += maxk * 16;
            kptre += maxk * 16;
            kptrf += maxk * 16;
        }

        _vindex = _mm512_mullo_epi32(_vindex, _mm512_set1_epi32(inch));

        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                for (int i = 0; i < 8; i++)
                {
                    __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                    _mm512_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 16;
                }
            }

            kptr0 += maxk * 8;
        }
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                for (int i = 0; i < 4; i++)
                {
                    __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                    _mm512_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 16;
                }
            }

            kptr0 += maxk * 4;
        }
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                for (int i = 0; i < 2; i++)
                {
                    __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                    _mm512_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 16;
                }
            }

            kptr0 += maxk * 2;
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                _mm512_store_ps(g00, _k0);
                g00 += 16;
            }
        }
    }
#endif // __AVX512F__
    for (; q + 7 < outch; q += 8)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;
        const float* kptr2 = (const float*)kernel + (q + 2) * inch * maxk;
        const float* kptr3 = (const float*)kernel + (q + 3) * inch * maxk;
        const float* kptr4 = (const float*)kernel + (q + 4) * inch * maxk;
        const float* kptr5 = (const float*)kernel + (q + 5) * inch * maxk;
        const float* kptr6 = (const float*)kernel + (q + 6) * inch * maxk;
        const float* kptr7 = (const float*)kernel + (q + 7) * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8);
#else
        float* g00 = kernel_tm.channel(q / 8);
#endif

#if __AVX2__
        __m256i _vindex = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex = _mm256_mullo_epi32(_vindex, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex_512, k1, sizeof(float));
                __m512 _k2 = _mm512_i32gather_ps(_vindex_512, k2, sizeof(float));
                __m512 _k3 = _mm512_i32gather_ps(_vindex_512, k3, sizeof(float));
                __m512 _k4 = _mm512_i32gather_ps(_vindex_512, k4, sizeof(float));
                __m512 _k5 = _mm512_i32gather_ps(_vindex_512, k5, sizeof(float));
                __m512 _k6 = _mm512_i32gather_ps(_vindex_512, k6, sizeof(float));
                __m512 _k7 = _mm512_i32gather_ps(_vindex_512, k7, sizeof(float));

                transpose16x8_ps(_k0, _k1, _k2, _k3, _k4, _k5, _k6, _k7);

                _mm512_storeu_ps(g00, _k0);
                _mm512_storeu_ps(g00 + 16, _k1);
                _mm512_storeu_ps(g00 + 16 * 2, _k2);
                _mm512_storeu_ps(g00 + 16 * 3, _k3);
                _mm512_storeu_ps(g00 + 16 * 4, _k4);
                _mm512_storeu_ps(g00 + 16 * 5, _k5);
                _mm512_storeu_ps(g00 + 16 * 6, _k6);
                _mm512_storeu_ps(g00 + 16 * 7, _k7);

                g00 += 128;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
            kptr2 += maxk * 16;
            kptr3 += maxk * 16;
            kptr4 += maxk * 16;
            kptr5 += maxk * 16;
            kptr6 += maxk * 16;
            kptr7 += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                __m256 _k1 = _mm256_i32gather_ps(k1, _vindex, sizeof(float));
                __m256 _k2 = _mm256_i32gather_ps(k2, _vindex, sizeof(float));
                __m256 _k3 = _mm256_i32gather_ps(k3, _vindex, sizeof(float));
                __m256 _k4 = _mm256_i32gather_ps(k4, _vindex, sizeof(float));
                __m256 _k5 = _mm256_i32gather_ps(k5, _vindex, sizeof(float));
                __m256 _k6 = _mm256_i32gather_ps(k6, _vindex, sizeof(float));
                __m256 _k7 = _mm256_i32gather_ps(k7, _vindex, sizeof(float));

                transpose8x8_ps(_k0, _k1, _k2, _k3, _k4, _k5, _k6, _k7);

                _mm256_store_ps(g00, _k0);
                _mm256_store_ps(g00 + 8, _k1);
                _mm256_store_ps(g00 + 8 * 2, _k2);
                _mm256_store_ps(g00 + 8 * 3, _k3);
                _mm256_store_ps(g00 + 8 * 4, _k4);
                _mm256_store_ps(g00 + 8 * 5, _k5);
                _mm256_store_ps(g00 + 8 * 6, _k6);
                _mm256_store_ps(g00 + 8 * 7, _k7);

                g00 += 64;
#else  // __AVX2__
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    g00[4] = k4[0];
                    g00[5] = k5[0];
                    g00[6] = k6[0];
                    g00[7] = k7[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    k4 += maxk;
                    k5 += maxk;
                    k6 += maxk;
                    k7 += maxk;
                    g00 += 8;
                }
#endif // __AVX2__
            }

            kptr0 += maxk * 8;
            kptr1 += maxk * 8;
            kptr2 += maxk * 8;
            kptr3 += maxk * 8;
            kptr4 += maxk * 8;
            kptr5 += maxk * 8;
            kptr6 += maxk * 8;
            kptr7 += maxk * 8;
        }

#if __AVX2__
        _vindex = _mm256_mullo_epi32(_vindex, _mm256_set1_epi32(inch));
#endif // __AVX2__

        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if !__AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;
#endif // !__AVX2__

                for (int i = 0; i < 4; i++)
                {
#if __AVX2__
                    __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                    _mm256_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 8;
#else  // __AVX2__
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    g00[4] = k4[0];
                    g00[5] = k5[0];
                    g00[6] = k6[0];
                    g00[7] = k7[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    k4 += maxk;
                    k5 += maxk;
                    k6 += maxk;
                    k7 += maxk;
                    g00 += 8;
#endif // __AVX2__
                }
            }

            kptr0 += maxk * 4;
#if !__AVX2__
            kptr1 += maxk * 4;
            kptr2 += maxk * 4;
            kptr3 += maxk * 4;
            kptr4 += maxk * 4;
            kptr5 += maxk * 4;
            kptr6 += maxk * 4;
            kptr7 += maxk * 4;
#endif // !__AVX2__
        }
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if !__AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;
#endif // !__AVX2__

                for (int i = 0; i < 2; i++)
                {
#if __AVX2__
                    __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                    _mm256_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 8;
#else  // __AVX2__
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    g00[4] = k4[0];
                    g00[5] = k5[0];
                    g00[6] = k6[0];
                    g00[7] = k7[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    k4 += maxk;
                    k5 += maxk;
                    k6 += maxk;
                    k7 += maxk;
                    g00 += 8;
#endif // __AVX2__
                }
            }

            kptr0 += maxk * 2;
#if !__AVX2__
            kptr1 += maxk * 2;
            kptr2 += maxk * 2;
            kptr3 += maxk * 2;
            kptr4 += maxk * 2;
            kptr5 += maxk * 2;
            kptr6 += maxk * 2;
            kptr7 += maxk * 2;
#endif // !__AVX2__
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                _mm256_store_ps(g00, _k0);
                g00 += 8;
#else  // __AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;

                g00[0] = k0[0];
                g00[1] = k1[0];
                g00[2] = k2[0];
                g00[3] = k3[0];
                g00[4] = k4[0];
                g00[5] = k5[0];
                g00[6] = k6[0];
                g00[7] = k7[0];
                g00 += 8;
#endif // __AVX2__
            }
        }
    }
#endif // __AVX__
    for (; q + 3 < outch; q += 4)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;
        const float* kptr2 = (const float*)kernel + (q + 2) * inch * maxk;
        const float* kptr3 = (const float*)kernel + (q + 3) * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4);
#elif __AVX__
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4);
#else
        float* g00 = kernel_tm.channel(q / 4);
#endif

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(maxk));
        __m256i _vindex_256 = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex_256 = _mm256_mullo_epi32(_vindex_256, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __AVX__
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex_512, k1, sizeof(float));
                __m512 _k2 = _mm512_i32gather_ps(_vindex_512, k2, sizeof(float));
                __m512 _k3 = _mm512_i32gather_ps(_vindex_512, k3, sizeof(float));

                transpose16x4_ps(_k0, _k1, _k2, _k3);

                _mm512_storeu_ps(g00, _k0);
                _mm512_storeu_ps(g00 + 16, _k1);
                _mm512_storeu_ps(g00 + 16 * 2, _k2);
                _mm512_storeu_ps(g00 + 16 * 3, _k3);

                g00 += 64;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
            kptr2 += maxk * 16;
            kptr3 += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex_256, sizeof(float));
                __m256 _k1 = _mm256_i32gather_ps(k1, _vindex_256, sizeof(float));
                __m256 _k2 = _mm256_i32gather_ps(k2, _vindex_256, sizeof(float));
                __m256 _k3 = _mm256_i32gather_ps(k3, _vindex_256, sizeof(float));

                transpose8x4_ps(_k0, _k1, _k2, _k3);

                _mm256_storeu_ps(g00, _k0);
                _mm256_storeu_ps(g00 + 8, _k1);
                _mm256_storeu_ps(g00 + 8 * 2, _k2);
                _mm256_storeu_ps(g00 + 8 * 3, _k3);

                g00 += 32;
#else  // __AVX2__
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    g00 += 4;
                }
#endif // __AVX2__
            }

            kptr0 += maxk * 8;
            kptr1 += maxk * 8;
            kptr2 += maxk * 8;
            kptr3 += maxk * 8;
        }
#endif // __AVX__
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                __m128 _k1 = _mm_i32gather_ps(k1, _vindex, sizeof(float));
                __m128 _k2 = _mm_i32gather_ps(k2, _vindex, sizeof(float));
                __m128 _k3 = _mm_i32gather_ps(k3, _vindex, sizeof(float));

                _MM_TRANSPOSE4_PS(_k0, _k1, _k2, _k3);

                _mm_store_ps(g00, _k0);
                _mm_store_ps(g00 + 4, _k1);
                _mm_store_ps(g00 + 4 * 2, _k2);
                _mm_store_ps(g00 + 4 * 3, _k3);

                g00 += 16;
#else  // __AVX2__
                for (int i = 0; i < 4; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    g00 += 4;
                }
#endif // __AVX2__
            }

            kptr0 += maxk * 4;
            kptr1 += maxk * 4;
            kptr2 += maxk * 4;
            kptr3 += maxk * 4;
        }

#if __AVX2__
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(inch));
#endif // __AVX2__

        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if !__AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
#endif // !__AVX2__

                for (int i = 0; i < 2; i++)
                {
#if __AVX2__
                    __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                    _mm_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 4;
#else  // __AVX2__
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    g00 += 4;
#endif // __AVX2__
                }
            }

            kptr0 += maxk * 2;
#if !__AVX2__
            kptr1 += maxk * 2;
            kptr2 += maxk * 2;
            kptr3 += maxk * 2;
#endif // !__AVX2__
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                _mm_store_ps(g00, _k0);
                g00 += 4;
#else  // __AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

                g00[0] = k0[0];
                g00[1] = k1[0];
                g00[2] = k2[0];
                g00[3] = k3[0];
                g00 += 4;
#endif // __AVX2__
            }
        }
    }
#endif // __SSE2__
    for (; q + 1 < outch; q += 2)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4 + (q % 4) / 2);
#elif __AVX__
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4 + (q % 4) / 2);
#elif __SSE2__
        float* g00 = kernel_tm.channel(q / 4 + (q % 4) / 2);
#else
        float* g00 = kernel_tm.channel(q / 2);
#endif

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(maxk));
        __m256i _vindex_256 = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex_256 = _mm256_mullo_epi32(_vindex_256, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex_512, k1, sizeof(float));
                _mm512_storeu_ps(g00, _k0);
                _mm512_storeu_ps(g00 + 16, _k1);
                g00 += 32;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex_256, sizeof(float));
                __m256 _k1 = _mm256_i32gather_ps(k1, _vindex_256, sizeof(float));
                _mm256_storeu_ps(g00, _k0);
                _mm256_storeu_ps(g00 + 8, _k1);
                g00 += 16;
#else  // __AVX2__
                g00[0] = k0[0];
                g00[1] = k0[maxk];
                g00[2] = k0[maxk * 2];
                g00[3] = k0[maxk * 3];
                g00[4] = k0[maxk * 4];
                g00[5] = k0[maxk * 5];
                g00[6] = k0[maxk * 6];
                g00[7] = k0[maxk * 7];
                g00[8] = k1[0];
                g00[9] = k1[maxk];
                g00[10] = k1[maxk * 2];
                g00[11] = k1[maxk * 3];
                g00[12] = k1[maxk * 4];
                g00[13] = k1[maxk * 5];
                g00[14] = k1[maxk * 6];
                g00[15] = k1[maxk * 7];
                g00 += 16;
#endif // __AVX2__
            }

            kptr0 += maxk * 8;
            kptr1 += maxk * 8;
        }
#endif // __AVX__
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                __m128 _k1 = _mm_i32gather_ps(k1, _vindex, sizeof(float));
                _mm_storeu_ps(g00, _k0);
                _mm_storeu_ps(g00 + 4, _k1);
                g00 += 8;
#else  // __AVX2__
                g00[0] = k0[0];
                g00[1] = k0[maxk];
                g00[2] = k0[maxk * 2];
                g00[3] = k0[maxk * 3];
                g00[4] = k1[0];
                g00[5] = k1[maxk];
                g00[6] = k1[maxk * 2];
                g00[7] = k1[maxk * 3];
                g00 += 8;
#endif // __AVX2__
            }

            kptr0 += maxk * 4;
            kptr1 += maxk * 4;
        }
#endif // __SSE2__
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

                for (int i = 0; i < 2; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    k0 += maxk;
                    k1 += maxk;
                    g00 += 2;
                }
            }

            kptr0 += maxk * 2;
            kptr1 += maxk * 2;
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

                g00[0] = k0[0];
                g00[1] = k1[0];
                g00 += 2;
            }
        }
    }
    for (; q < outch; q++)
    {
        const float* kptr = (const float*)kernel + q * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4 + (q % 4) / 2 + q % 2);
#elif __AVX__
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4 + (q % 4) / 2 + q % 2);
#elif __SSE2__
        float* g00 = kernel_tm.channel(q / 4 + (q % 4) / 2 + q % 2);
#else
        float* g00 = kernel_tm.channel(q / 2 + q % 2);
#endif

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(maxk));
        __m256i _vindex_256 = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex_256 = _mm256_mullo_epi32(_vindex_256, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                _mm512_storeu_ps(g00, _k0);
                g00 += 16;
            }

            kptr += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex_256, sizeof(float));
                _mm256_storeu_ps(g00, _k0);
                g00 += 8;
#else  // __AVX2__
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0[0];
                    k0 += maxk;
                    g00 += 1;
                }
#endif // __AVX2__
            }

            kptr += maxk * 8;
        }
#endif // __AVX__
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                _mm_storeu_ps(g00, _k0);
                g00 += 4;
#else  // __AVX2__
                for (int i = 0; i < 4; i++)
                {
                    g00[0] = k0[0];
                    k0 += maxk;
                    g00 += 1;
                }
#endif // __AVX2__
            }

            kptr += maxk * 4;
        }
#endif // __SSE2__
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

                for (int i = 0; i < 2; i++)
                {
                    g00[0] = k0[0];
                    k0 += maxk;
                    g00 += 1;
                }
            }

            kptr += maxk * 2;
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

                g00[0] = k0[0];
                g00++;
            }
        }
    }
}